

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

int xmlSaveSwitchEncoding(xmlSaveCtxtPtr ctxt,char *encoding)

{
  xmlOutputBufferPtr output;
  xmlCharEncodingHandlerPtr pxVar1;
  xmlBufPtr pxVar2;
  xmlOutputBufferPtr buf;
  char *encoding_local;
  xmlSaveCtxtPtr ctxt_local;
  
  output = ctxt->buf;
  if (((encoding != (char *)0x0) && (output->encoder == (xmlCharEncodingHandlerPtr)0x0)) &&
     (output->conv == (xmlBufPtr)0x0)) {
    pxVar1 = xmlFindCharEncodingHandler(encoding);
    output->encoder = pxVar1;
    if (output->encoder == (xmlCharEncodingHandlerPtr)0x0) {
      xmlSaveErr(0x57b,(xmlNodePtr)0x0,encoding);
      return -1;
    }
    pxVar2 = xmlBufCreate();
    output->conv = pxVar2;
    if (output->conv == (xmlBufPtr)0x0) {
      xmlCharEncCloseFunc(output->encoder);
      xmlSaveErrMemory("creating encoding buffer");
      return -1;
    }
    xmlCharEncOutput(output,1);
  }
  return 0;
}

Assistant:

static int xmlSaveSwitchEncoding(xmlSaveCtxtPtr ctxt, const char *encoding) {
    xmlOutputBufferPtr buf = ctxt->buf;

    if ((encoding != NULL) && (buf->encoder == NULL) && (buf->conv == NULL)) {
	buf->encoder = xmlFindCharEncodingHandler((const char *)encoding);
	if (buf->encoder == NULL) {
	    xmlSaveErr(XML_SAVE_UNKNOWN_ENCODING, NULL,
		       (const char *)encoding);
	    return(-1);
	}
	buf->conv = xmlBufCreate();
	if (buf->conv == NULL) {
	    xmlCharEncCloseFunc(buf->encoder);
	    xmlSaveErrMemory("creating encoding buffer");
	    return(-1);
	}
	/*
	 * initialize the state, e.g. if outputting a BOM
	 */
        xmlCharEncOutput(buf, 1);
    }
    return(0);
}